

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O1

void cupdlp_diffDotDiff(CUPDLPwork *w,cupdlp_float *x1,cupdlp_float *x2,cupdlp_float *y1,
                       cupdlp_float *y2,cupdlp_int len,cupdlp_float *res)

{
  cupdlp_float *pcVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  memcpy(w->buffer2,x1,(long)len * 8);
  uVar3 = (ulong)(uint)len;
  if (0 < len) {
    pcVar1 = w->buffer2;
    uVar2 = 0;
    do {
      pcVar1[uVar2] = pcVar1[uVar2] - x2[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  memcpy(w->buffer3,y1,(long)len * 8);
  pcVar1 = w->buffer3;
  if (0 < len) {
    uVar2 = 0;
    do {
      pcVar1[uVar2] = pcVar1[uVar2] - y2[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  if (len < 1) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    uVar2 = 0;
    do {
      dVar4 = dVar4 + w->buffer2[uVar2] * pcVar1[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  *res = dVar4;
  return;
}

Assistant:

void cupdlp_diffDotDiff(CUPDLPwork *w, const cupdlp_float *x1,
                        const cupdlp_float *x2, const cupdlp_float *y1,
                        const cupdlp_float *y2, const cupdlp_int len,
                        cupdlp_float *res) {
  CUPDLP_COPY_VEC(w->buffer2, x1, cupdlp_float, len);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(w, len, &alpha, x2, w->buffer2);
  CUPDLP_COPY_VEC(w->buffer3, y1, cupdlp_float, len);
  cupdlp_axpy(w, len, &alpha, y2, w->buffer3);
  // reduce step
  cupdlp_dot(w, len, w->buffer2, w->buffer3, res);
}